

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall BenevolentBotStrategy::place(BenevolentBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  int iVar3;
  iterator __begin2;
  pointer ppCVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  pointer ppCVar8;
  bool bVar9;
  double dVar10;
  
  iVar7 = *(this->super_PlayerStrategy).numWeakest;
  if (iVar7 == -1) {
    pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    iVar6 = 0;
    ppCVar4 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (ppCVar8 = ppCVar4; ppCVar8 != ppCVar2; ppCVar8 = ppCVar8 + 1) {
      iVar7 = *(*ppCVar8)->pNumberOfTroops;
      iVar3 = iVar6;
      if (iVar7 < iVar6) {
        iVar3 = iVar7;
      }
      bVar9 = iVar6 == 0;
      iVar6 = iVar3;
      if (bVar9) {
        iVar6 = iVar7;
      }
    }
    iVar7 = 0;
    for (; ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1) {
      iVar7 = iVar7 + (uint)(*(*ppCVar4)->pNumberOfTroops == iVar6);
    }
    piVar5 = (int *)operator_new(4);
    *piVar5 = iVar7;
    (this->super_PlayerStrategy).numWeakest = piVar5;
  }
  dVar10 = ceil((double)*(this->super_PlayerStrategy).armiesToPlace / (double)iVar7);
  return (int)dVar10;
}

Assistant:

int BenevolentBotStrategy::place() {
    if (*numWeakest == -1) {
        int count = 0;
        int weakest = 0;
        for (auto* country : *player->getOwnedCountries()) {
            if (weakest == 0 || country->getNumberOfTroops() < weakest) {
                weakest = country->getNumberOfTroops();
            }
        }

        // Then find out how many other countries have the same number of armies as it
        for (auto* country : *player->getOwnedCountries()) {
            if (country->getNumberOfTroops() == weakest) {
                count++;
            }
        }

        numWeakest = new int(count);
    }
    return ceil((double)*armiesToPlace / (double)*numWeakest);
}